

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void pbrt::processError(char *errorType,FileLoc *loc,char *message)

{
  bool bVar1;
  int iVar2;
  string errorString;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,errorType,(allocator<char> *)&local_30);
  Red(&errorString,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (loc != (FileLoc *)0x0) {
    FileLoc::ToString_abi_cxx11_(&local_30,loc);
    std::operator+(&local_50,": ",&local_30);
    std::__cxx11::string::append((string *)&errorString);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::append((char *)&errorString);
  std::__cxx11::string::append((char *)&errorString);
  if (processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&processError(char_const*,pbrt::FileLoc_const*,char_const*)::
                                 lastError_abi_cxx11_);
    if (iVar2 != 0) {
      processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_._M_dataplus.
      _M_p = (pointer)&processError(char_const*,pbrt::FileLoc_const*,char_const*)::
                       lastError_abi_cxx11_.field_2;
      processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_.
      _M_string_length = 0;
      processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_.field_2.
      _M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&processError(char_const*,pbrt::FileLoc_const*,char_const*)::
                           lastError_abi_cxx11_);
    }
  }
  std::mutex::lock(&processError::mutex);
  bVar1 = std::operator!=(&errorString,
                          &processError(char_const*,pbrt::FileLoc_const*,char_const*)::
                           lastError_abi_cxx11_);
  if (bVar1) {
    fprintf(_stderr,"%s\n",errorString._M_dataplus._M_p);
    if (LOGGING_LogLevel < 1) {
      Log<std::__cxx11::string&>
                (Verbose,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/error.cpp"
                 ,0x34,"%s",&errorString);
    }
    std::__cxx11::string::_M_assign
              ((string *)
               &processError(char_const*,pbrt::FileLoc_const*,char_const*)::lastError_abi_cxx11_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&processError::mutex);
  std::__cxx11::string::~string((string *)&errorString);
  return;
}

Assistant:

static void processError(const char *errorType, const FileLoc *loc, const char *message) {
    // Build up an entire formatted error string and print it all at once;
    // this way, if multiple threads are printing messages at once, they
    // don't get jumbled up...
    std::string errorString = Red(errorType);

    if (loc)
        errorString += ": " + loc->ToString();

    errorString += ": ";
    errorString += message;

    // Print the error message (but not more than one time).
    static std::string lastError;
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);
    if (errorString != lastError) {
        fprintf(stderr, "%s\n", errorString.c_str());
        LOG_VERBOSE("%s", errorString);
        lastError = errorString;
    }
}